

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integration_test.cc
# Opt level: O0

void __thiscall
prometheus::anon_unknown_0::BasicAuthIntegrationTest_shouldRejectRequestWithWrongUsername_Test::
~BasicAuthIntegrationTest_shouldRejectRequestWithWrongUsername_Test
          (BasicAuthIntegrationTest_shouldRejectRequestWithWrongUsername_Test *this)

{
  BasicAuthIntegrationTest_shouldRejectRequestWithWrongUsername_Test *this_local;
  
  ~BasicAuthIntegrationTest_shouldRejectRequestWithWrongUsername_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(BasicAuthIntegrationTest, shouldRejectRequestWithWrongUsername) {
  fetchPrePerform_ = [&](CURL* curl) {
    curl_easy_setopt(curl, CURLOPT_HTTPAUTH, CURLAUTH_BASIC);
    curl_easy_setopt(curl, CURLOPT_USERNAME, "dummy");
    curl_easy_setopt(curl, CURLOPT_PASSWORD, password_.c_str());
  };

  const auto metrics = FetchMetrics(default_metrics_path_);
  ASSERT_EQ(metrics.code, 401);
}